

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::ct_constant<8L>_>
                    *param_2)

{
  ostream *poVar1;
  ct_constant<8L> local_1c;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_1b;
  ct_equation<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::ct_constant<8L>_>
  *local_18;
  ct_equation<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::ct_constant<8L>_>
  *param_1_local;
  ostream *stream_local;
  
  local_18 = param_2;
  param_1_local =
       (ct_equation<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::ct_constant<8L>_>
        *)stream;
  poVar1 = std::operator<<(stream,"ct_equation(");
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  ::ct_binary_expr(&local_1b);
  poVar1 = operator<<(poVar1,&local_1b);
  poVar1 = std::operator<<(poVar1," = ");
  ct_constant<8L>::ct_constant(&local_1c);
  poVar1 = operator<<(poVar1,&local_1c);
  std::operator<<(poVar1,")");
  return (ostream *)param_1_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }